

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::ScaleLayerParams::_InternalSerialize
          (ScaleLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong *puVar1;
  bool bVar2;
  uint8_t *puVar3;
  LogMessage *pLVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong *puVar10;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar9 = (this->_shapescale_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar9) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      pLVar4 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar4);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *puVar3 = '\n';
    target = puVar3 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    puVar10 = (ulong *)(this->shapescale_).arena_or_elements_;
    puVar1 = puVar10 + (this->shapescale_).current_size_;
    do {
      pbVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar7 = *puVar10;
      *pbVar5 = (byte)uVar7;
      if (uVar7 < 0x80) {
        target = pbVar5 + 1;
      }
      else {
        *pbVar5 = (byte)uVar7 | 0x80;
        pbVar5[1] = (byte)(uVar7 >> 7);
        target = pbVar5 + 2;
        if (0x3fff < uVar7) {
          uVar8 = (ulong)pbVar5[1];
          uVar7 = uVar7 >> 7;
          do {
            target[-1] = (byte)uVar8 | 0x80;
            uVar6 = uVar7 >> 7;
            *target = (byte)uVar6;
            target = target + 1;
            uVar8 = uVar6 & 0xffffffff;
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar6;
          } while (bVar2);
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 < puVar1);
  }
  if ((this != (ScaleLayerParams *)_ScaleLayerParams_default_instance_) &&
     (this->scale_ != (WeightParams *)0x0)) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::WeightParams>(2,this->scale_,puVar3,stream)
    ;
  }
  if (this->hasbias_ == true) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray(3,this->hasbias_,puVar3);
  }
  uVar9 = (this->_shapebias_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar9) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      pLVar4 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar4);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *puVar3 = '\"';
    target = puVar3 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    puVar10 = (ulong *)(this->shapebias_).arena_or_elements_;
    puVar1 = puVar10 + (this->shapebias_).current_size_;
    do {
      pbVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar7 = *puVar10;
      *pbVar5 = (byte)uVar7;
      if (uVar7 < 0x80) {
        target = pbVar5 + 1;
      }
      else {
        *pbVar5 = (byte)uVar7 | 0x80;
        pbVar5[1] = (byte)(uVar7 >> 7);
        target = pbVar5 + 2;
        if (0x3fff < uVar7) {
          uVar8 = (ulong)pbVar5[1];
          uVar7 = uVar7 >> 7;
          do {
            target[-1] = (byte)uVar8 | 0x80;
            uVar6 = uVar7 >> 7;
            *target = (byte)uVar6;
            target = target + 1;
            uVar8 = uVar6 & 0xffffffff;
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar6;
          } while (bVar2);
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 < puVar1);
  }
  if ((this != (ScaleLayerParams *)_ScaleLayerParams_default_instance_) &&
     (this->bias_ != (WeightParams *)0x0)) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::WeightParams>(5,this->bias_,puVar3,stream);
  }
  uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    uVar7 = uVar7 & 0xfffffffffffffffc;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,*(void **)(uVar7 + 8),*(int *)(uVar7 + 0x10),target);
  }
  return target;
}

Assistant:

uint8_t* ScaleLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ScaleLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 shapeScale = 1;
  {
    int byte_size = _shapescale_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          1, _internal_shapescale(), byte_size, target);
    }
  }

  // .CoreML.Specification.WeightParams scale = 2;
  if (this->_internal_has_scale()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::scale(this), target, stream);
  }

  // bool hasBias = 3;
  if (this->_internal_hasbias() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_hasbias(), target);
  }

  // repeated uint64 shapeBias = 4;
  {
    int byte_size = _shapebias_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          4, _internal_shapebias(), byte_size, target);
    }
  }

  // .CoreML.Specification.WeightParams bias = 5;
  if (this->_internal_has_bias()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::bias(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ScaleLayerParams)
  return target;
}